

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_collectgarbage(lua_State *L)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int unaff_retaddr;
  int res;
  int32_t data;
  int opt;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  char *in_stack_fffffffffffffff8;
  
  iVar1 = lj_lib_checkopt(_data,res,unaff_retaddr,in_stack_fffffffffffffff8);
  lj_lib_optint((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                (int)((ulong)in_RDI >> 0x20),(int32_t)in_RDI);
  if (iVar1 == 3) {
    **(double **)(in_RDI + 0x18) = (double)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50) / 1024.0;
  }
  else {
    iVar2 = lua_gc((lua_State *)CONCAT44(res,unaff_retaddr),
                   (int)((ulong)in_stack_fffffffffffffff8 >> 0x20),(int)in_stack_fffffffffffffff8);
    if ((iVar1 == 5) || (iVar1 == 9)) {
      *(int *)(*(long *)(in_RDI + 0x18) + 4) = -2 - iVar2;
    }
    else {
      **(double **)(in_RDI + 0x18) = (double)iVar2;
    }
  }
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 8;
  return 1;
}

Assistant:

LJLIB_CF(collectgarbage)
{
  int opt = lj_lib_checkopt(L, 1, LUA_GCCOLLECT,  /* ORDER LUA_GC* */
    "\4stop\7restart\7collect\5count\1\377\4step\10setpause\12setstepmul\1\377\11isrunning");
  int32_t data = lj_lib_optint(L, 2, 0);
  if (opt == LUA_GCCOUNT) {
    setnumV(L->top, (lua_Number)G(L)->gc.total/1024.0);
  } else {
    int res = lua_gc(L, opt, data);
    if (opt == LUA_GCSTEP || opt == LUA_GCISRUNNING)
      setboolV(L->top, res);
    else
      setintV(L->top, res);
  }
  L->top++;
  return 1;
}